

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::
Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
::Action(Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
         *this,ActionInterface<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
               *impl)

{
  __shared_ptr<testing::ActionInterface<unsigned_int(std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,unsigned_char,unsigned_char,unsigned_char)>,(__gnu_cxx::_Lock_policy)2>
  local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  __shared_ptr<testing::ActionInterface<unsigned_int(std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,unsigned_char,unsigned_char,unsigned_char)>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::ActionInterface<unsigned_int(std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,unsigned_char,unsigned_char,unsigned_char)>,void>
            (local_20,impl);
  std::
  function<unsigned_int(std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,unsigned_char,unsigned_char,unsigned_char)>
  ::
  function<testing::Action<unsigned_int(std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,unsigned_char,unsigned_char,unsigned_char)>::ActionAdapter,void>
            ((function<unsigned_int(std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,unsigned_char,unsigned_char,unsigned_char)>
              *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}